

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v10::detail::write_escaped_char<char,fmt::v10::appender>(appender out,char v)

{
  bool bVar1;
  uint32_t cp;
  undefined7 in_register_00000031;
  char v_array [1];
  char local_2a;
  char local_29;
  find_escape_result<char> local_28;
  
  local_28.begin = (char *)CONCAT71(local_28.begin._1_7_,0x27);
  local_2a = v;
  local_29 = v;
  buffer<char>::push_back
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
             (char *)&local_28);
  cp = (uint32_t)CONCAT71(in_register_00000031,v);
  bVar1 = needs_escape(cp);
  if (((v == '\"' | ~bVar1) & v != '\'') == 0) {
    local_28.begin = &local_2a;
    local_28.end = &local_29;
    local_28.cp = cp;
    out = write_escaped_cp<fmt::v10::appender,char>(out,&local_28);
  }
  else {
    buffer<char>::push_back
              ((buffer<char> *)
               out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,&local_29);
  }
  local_28.begin = (char *)CONCAT71(local_28.begin._1_7_,0x27);
  buffer<char>::push_back
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
             (char *)&local_28);
  return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
}

Assistant:

auto write_escaped_char(OutputIt out, Char v) -> OutputIt {
  Char v_array[1] = {v};
  *out++ = static_cast<Char>('\'');
  if ((needs_escape(static_cast<uint32_t>(v)) && v != static_cast<Char>('"')) ||
      v == static_cast<Char>('\'')) {
    out = write_escaped_cp(out,
                           find_escape_result<Char>{v_array, v_array + 1,
                                                    static_cast<uint32_t>(v)});
  } else {
    *out++ = v;
  }
  *out++ = static_cast<Char>('\'');
  return out;
}